

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteDeltaFor
               (int *values,bool *validity,bitpacking_width_t width,int frame_of_reference,
               int delta_offset,int *original_values,idx_t count,void *data_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  int *piVar5;
  idx_t iVar6;
  ulong uVar7;
  bitpacking_metadata_encoded_t encoded_value;
  ulong uVar8;
  ulong uVar9;
  uint32_t *in;
  ulong uVar10;
  uint32_t local_b8 [34];
  
  iVar6 = count;
  if ((count & 0x1f) != 0) {
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
    iVar6 = (count - uVar4) + 0x20;
  }
  uVar7 = iVar6 * width >> 3;
  FlushAndCreateSegmentIfFull((BitpackingCompressionState<int,_true,_int> *)data_ptr,uVar7 + 0xc,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  lVar3 = *(long *)((long)data_ptr + 0x48);
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  *(long *)((long)data_ptr + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x4000000;
  piVar5 = *(int **)((long)data_ptr + 0x40);
  *piVar5 = frame_of_reference;
  piVar5[1] = (uint)width;
  piVar5[2] = delta_offset;
  piVar5 = piVar5 + 3;
  *(int **)((long)data_ptr + 0x40) = piVar5;
  uVar10 = count & 0xffffffffffffffe0;
  if (uVar10 != 0) {
    uVar9 = 0;
    uVar8 = 0;
    in = (uint32_t *)values;
    do {
      duckdb_fastpforlib::fastpack(in,(uint32_t *)((uVar9 >> 3) + (long)piVar5),(uint)width);
      uVar8 = uVar8 + 0x20;
      in = in + 0x20;
      uVar9 = uVar9 + (ulong)width * 0x20;
    } while (uVar8 < uVar10);
  }
  if ((count & 0x1f) != 0) {
    uVar8 = (ulong)(((uint)count & 0x1f) << 2);
    switchD_010444a0::default((void *)((long)local_b8 + uVar8),0,0x80 - uVar8);
    switchD_015df945::default(local_b8,values + uVar10,uVar8);
    duckdb_fastpforlib::fastpack
              (local_b8,(uint32_t *)((long)piVar5 + (width * uVar10 >> 3)),(uint)width);
  }
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + uVar7;
  UpdateStats((BitpackingCompressionState<int,_true,_int> *)data_ptr,count);
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}